

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O3

Value * __thiscall
wabt::Decompiler::WrapNAry
          (Value *__return_storage_ptr__,Decompiler *this,
          vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *args,
          string_view prefix,string_view postfix,Precedence precedence)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *__x;
  pointer pVVar1;
  pointer pbVar2;
  const_iterator __position;
  byte bVar3;
  byte bVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  size_t amount;
  Value *child_1;
  pointer pVVar8;
  pointer pVVar9;
  char *pcVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  pointer pbVar11;
  pointer pbVar12;
  Value *child_2;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  string_view first_indent;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *__range3;
  string s_1;
  undefined1 local_a8 [40];
  char *local_80;
  ulong local_78;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  
  local_80 = prefix._M_str;
  sVar6 = prefix._M_len;
  pVVar8 = (args->
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (args->
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar8 != pVVar1) {
    lVar5 = 0;
    uVar13 = 0;
    pVVar9 = pVVar8;
    bVar4 = 0;
    do {
      bVar3 = bVar4;
      pbVar2 = (pVVar9->v).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar15 = 0;
      pbVar12 = (pVVar9->v).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (pbVar11 = pbVar12; pbVar11 != pbVar2; pbVar11 = pbVar11 + 1) {
        if (uVar15 <= pbVar11->_M_string_length) {
          uVar15 = pbVar11->_M_string_length;
        }
      }
      if (uVar13 <= uVar15) {
        uVar13 = uVar15;
      }
      lVar5 = lVar5 + uVar15;
      bVar16 = 0x20 < (ulong)((long)pbVar2 - (long)pbVar12);
      pVVar9 = pVVar9 + 1;
      bVar4 = bVar3 | bVar16;
    } while (pVVar9 != pVVar1);
    if (((bool)(bVar3 | bVar16)) ||
       (this->target_exp_width <= lVar5 + sVar6 + postfix._M_len && pVVar8 != pVVar1)) {
      local_a8._0_8_ = (pointer)0x0;
      local_a8._8_8_ = (pointer)0x0;
      local_a8._16_8_ = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr__->v,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8);
      __return_storage_ptr__->precedence = precedence;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
      local_78 = this->target_exp_width;
      pVVar8 = (args->
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_70 = (args->
                 super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      if (pVVar8 != local_70) {
        uVar15 = 0;
        do {
          bVar16 = local_78 <= uVar13 + sVar6;
          amount = sVar6;
          if (bVar16) {
            amount = this->indent_amount;
          }
          sVar7 = 0;
          if (!bVar16 && uVar15 == 0) {
            sVar7 = sVar6;
          }
          pcVar10 = (char *)0x0;
          if (!bVar16 && uVar15 == 0) {
            pcVar10 = local_80;
          }
          first_indent._M_str = pcVar10;
          first_indent._M_len = sVar7;
          IndentValue(this,pVVar8,amount,first_indent);
          if (uVar15 < ((long)(args->
                              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
            std::__cxx11::string::append
                      ((char *)((pVVar8->v).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1));
          }
          pbVar12 = (pVVar8->v).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar5 = (long)(pVVar8->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5;
          if (0 < lVar5) {
            uVar14 = lVar5 + 1;
            do {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,pbVar12);
              pbVar12 = pbVar12 + 1;
              uVar14 = uVar14 - 1;
            } while (1 < uVar14);
          }
          uVar15 = uVar15 + 1;
          pVVar8 = pVVar8 + 1;
        } while (pVVar8 != local_70);
      }
      if (local_78 <= uVar13 + sVar6) {
        __position._M_current =
             (__return_storage_ptr__->v).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_a8._0_8_ = (pointer)(local_a8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,local_80,local_80 + sVar6);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_insert_rval(&__return_storage_ptr__->v,__position,(value_type *)local_a8);
        if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
        }
      }
      std::__cxx11::string::append
                ((char *)((__return_storage_ptr__->v).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1),(ulong)postfix._M_str);
      return __return_storage_ptr__;
    }
  }
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,local_80,local_80 + sVar6);
  pVVar8 = (args->
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (args->
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar8 != pVVar1) {
    do {
      if (pVVar8 != (args->
                    super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                    )._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::append(local_a8);
      }
      std::__cxx11::string::_M_append
                (local_a8,(ulong)(((pVVar8->v).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      pVVar8 = pVVar8 + 1;
    } while (pVVar8 != pVVar1);
  }
  std::__cxx11::string::append(local_a8,(ulong)postfix._M_str);
  pbVar12 = (pointer)(local_a8 + 0x10);
  if ((pointer)local_a8._0_8_ == pbVar12) {
    local_58._8_8_ = local_a8._24_8_;
    local_68 = (pointer)local_58;
  }
  else {
    local_68 = (pointer)local_a8._0_8_;
  }
  local_58._0_8_ = local_a8._16_8_;
  local_60 = (pointer)local_a8._8_8_;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = local_a8._16_8_ & 0xffffffffffffff00;
  __x = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_58 + 0x10);
  local_48._M_allocated_capacity = 0;
  local_48._8_8_ = 0;
  local_38 = 0;
  local_a8._0_8_ = pbVar12;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_initialize<std::__cxx11::string_const*>(__x,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->v,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__x);
  __return_storage_ptr__->precedence = precedence;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)__x);
  if (local_68 != (pointer)local_58) {
    operator_delete(local_68,(ulong)(local_58._0_8_ + 1));
  }
  if ((pointer)local_a8._0_8_ != pbVar12) {
    operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

Value WrapNAry(std::vector<Value>& args,
                 std::string_view prefix,
                 std::string_view postfix,
                 Precedence precedence) {
    size_t total_width = 0;
    size_t max_width = 0;
    bool multiline = false;
    for (auto& child : args) {
      auto w = child.width();
      max_width = std::max(max_width, w);
      total_width += w;
      multiline = multiline || child.v.size() > 1;
    }
    if (!multiline &&
        (total_width + prefix.size() + postfix.size() < target_exp_width ||
         args.empty())) {
      // Single line.
      auto s = std::string(prefix);
      for (auto& child : args) {
        if (&child != &args[0])
          s += ", ";
        s += child.v[0];
      }
      s += postfix;
      return Value{{std::move(s)}, precedence};
    } else {
      // Multi-line.
      Value ml{{}, precedence};
      auto ident_with_name = max_width + prefix.size() < target_exp_width;
      size_t i = 0;
      for (auto& child : args) {
        IndentValue(child, ident_with_name ? prefix.size() : indent_amount,
                    !i && ident_with_name ? prefix : std::string_view{});
        if (i < args.size() - 1) {
          child.v.back() += ",";
        }
        std::move(child.v.begin(), child.v.end(), std::back_inserter(ml.v));
        i++;
      }
      if (!ident_with_name) {
        ml.v.insert(ml.v.begin(), std::string(prefix));
      }
      ml.v.back() += postfix;
      return ml;
    }
  }